

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool intersect_skewed_uint16_nonempty(uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint16_t uVar10;
  int iVar11;
  
  iVar4 = (int)size_l;
  iVar8 = 0;
  if (size_s == 0) {
    return false;
  }
  uVar3 = *small;
  lVar7 = 0;
  puVar6 = large;
  do {
    uVar1 = *puVar6;
    while (uVar3 <= uVar1) {
      if (uVar1 <= uVar3) {
        return uVar1 <= uVar3;
      }
      if (size_s - 1 == lVar7) {
        return uVar1 <= uVar3;
      }
      lVar2 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      uVar3 = small[lVar2];
    }
    iVar11 = iVar8 + 1;
    iVar9 = iVar11;
    if ((iVar11 < iVar4) && (large[iVar11] < uVar3)) {
      iVar8 = iVar8 + 2;
      iVar5 = 1;
      if (iVar8 < iVar4) {
        iVar5 = 1;
        do {
          uVar10 = large[iVar8];
          if (uVar3 <= uVar10) goto LAB_00103765;
          iVar9 = iVar5 * 2;
          iVar8 = iVar11 + iVar5 * 2;
          iVar5 = iVar9;
        } while (iVar8 < iVar4);
      }
      uVar10 = large[iVar4 + -1];
      iVar8 = iVar4 + -1;
LAB_00103765:
      iVar9 = iVar8;
      if (((uVar10 != uVar3) && (iVar9 = iVar4, uVar3 <= uVar10)) &&
         (iVar9 = iVar8, (iVar5 >> 1) + iVar11 + 1 != iVar8)) {
        iVar11 = (iVar5 >> 1) + iVar11;
        do {
          iVar9 = iVar11 + iVar8 >> 1;
          if (large[iVar9] == uVar3) break;
          iVar5 = iVar9;
          if (large[iVar9] < uVar3) {
            iVar5 = iVar8;
            iVar11 = iVar9;
          }
          iVar9 = iVar5;
          iVar8 = iVar5;
        } while (iVar11 + 1 != iVar5);
      }
    }
    iVar8 = iVar9;
    if ((long)iVar8 == size_l) {
      return false;
    }
    puVar6 = large + iVar8;
  } while( true );
}

Assistant:

bool intersect_skewed_uint16_nonempty(const uint16_t *small, size_t size_s,
                                      const uint16_t *large, size_t size_l) {
    size_t idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return false;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            return true;
        }
    }

    return false;
}